

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

void __thiscall rw::Clump::destroy(Clump *this)

{
  Atomic *pAVar1;
  Light *pLVar2;
  Camera *pCVar3;
  Atomic *pAVar4;
  Light *pLVar5;
  Camera *pCVar6;
  Frame *this_00;
  Camera *c;
  LLLink *lnk_2;
  LLLink *_next_2;
  Light *l;
  LLLink *lnk_1;
  LLLink *_next_1;
  Atomic *a;
  LLLink *lnk;
  LLLink *_next;
  Frame *f;
  Clump *this_local;
  
  PluginList::destruct((PluginList *)&s_plglist,this);
  a = (Atomic *)(this->atomics).link.next;
  while( true ) {
    pAVar1 = *(Atomic **)&(a->object).object;
    pAVar4 = (Atomic *)LinkList::end(&this->atomics);
    if (a == pAVar4) break;
    pAVar4 = Atomic::fromClump((LLLink *)a);
    removeAtomic(this,pAVar4);
    Atomic::destroy(pAVar4);
    a = pAVar1;
  }
  l = (Light *)(this->lights).link.next;
  while( true ) {
    pLVar2 = *(Light **)&(l->object).object;
    pLVar5 = (Light *)LinkList::end(&this->lights);
    if (l == pLVar5) break;
    pLVar5 = Light::fromClump((LLLink *)l);
    removeLight(this,pLVar5);
    Light::destroy(pLVar5);
    l = pLVar2;
  }
  c = (Camera *)(this->cameras).link.next;
  while( true ) {
    pCVar3 = *(Camera **)&(c->object).object;
    pCVar6 = (Camera *)LinkList::end(&this->cameras);
    if (c == pCVar6) break;
    pCVar6 = Camera::fromClump((LLLink *)c);
    removeCamera(this,pCVar6);
    Camera::destroy(pCVar6);
    c = pCVar3;
  }
  this_00 = getFrame(this);
  if (this_00 != (Frame *)0x0) {
    Frame::destroyHierarchy(this_00);
  }
  (*DAT_00168638)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Clump::destroy(void)
{
	Frame *f;
	s_plglist.destruct(this);
	FORLIST(lnk, this->atomics){
		Atomic *a = Atomic::fromClump(lnk);
		this->removeAtomic(a);
		a->destroy();
	}
	FORLIST(lnk, this->lights){
		Light *l = Light::fromClump(lnk);
		this->removeLight(l);
		l->destroy();
	}
	FORLIST(lnk, this->cameras){
		Camera *c = Camera::fromClump(lnk);
		this->removeCamera(c);
		c->destroy();
	}
	if(f = this->getFrame(), f)
		f->destroyHierarchy();
	assert(this->world == nil);
	rwFree(this);
	numAllocated--;
}